

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.h
# Opt level: O1

vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
* __thiscall
anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>::derivatives_at
          (vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
           *__return_storage_ptr__,
          Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_> *this,double u,double v,
          Index order)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  peVar1 = (this->m_surface_geometry).m_entry.
           super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar2 = (peVar1->m_data).
           super___shared_ptr<anurbs::NurbsSurfaceGeometry<2L>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (peVar1->m_data).
            super___shared_ptr<anurbs::NurbsSurfaceGeometry<2L>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  (*(peVar2->super_SurfaceBase<2L>)._vptr_SurfaceBase[7])(__return_storage_ptr__);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vector> derivatives_at(const double u, const double v,
        const Index order) const override
    {
        return m_surface_geometry->derivatives_at(u, v, order);
    }